

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::refineregion
          (tetgenmesh *this,face *splitsh,arraypool *cavpoints,arraypool *cavfaces,
          arraypool *cavshells,arraypool *newtets,arraypool *crosstets,arraypool *misfaces)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  interresult iVar6;
  point pdVar7;
  point pdVar8;
  unsigned_long uVar9;
  int local_130;
  int i;
  int t1ver;
  long baknum;
  undefined1 local_118 [4];
  interresult dir;
  insertvertexflags ivf;
  point refpt;
  point pb;
  point pa;
  point steinpt;
  face *paryseg;
  face splitseg;
  triface spintet;
  triface searchtet;
  arraypool *newtets_local;
  arraypool *cavshells_local;
  arraypool *cavfaces_local;
  arraypool *cavpoints_local;
  face *splitsh_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&splitseg.shver);
  face::face((face *)&paryseg);
  insertvertexflags::insertvertexflags((insertvertexflags *)local_118);
  lVar1 = this->points->items;
  if (2 < this->b->verbose) {
    pdVar7 = sorg(this,splitsh);
    uVar2 = pointmark(this,pdVar7);
    pdVar7 = sdest(this,splitsh);
    uVar3 = pointmark(this,pdVar7);
    pdVar7 = sapex(this,splitsh);
    uVar4 = pointmark(this,pdVar7);
    printf("      Refining region at edge (%d, %d, %d).\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  }
  pdVar7 = sorg(this,splitsh);
  pdVar8 = sdest(this,splitsh);
  makepoint(this,&pa,FREEFACETVERTEX);
  for (local_130 = 0; local_130 < 3; local_130 = local_130 + 1) {
    pa[local_130] = (pdVar7[local_130] + pdVar8[local_130]) * 0.5;
  }
  dir = INTERSECT;
  ivf.rejflag = 1;
  ivf.cdtflag = 4;
  ivf.assignmeshsize = 1;
  ivf.chkencflag = this->b->metric;
  ivf.refinesh.shver = this->useinsertradius;
  point2tetorg(this,pdVar7,(triface *)&spintet.ver);
  local_118 = (undefined1  [4])0x1;
  ivf.validflag = 1;
  iVar5 = insertpoint_cdt(this,pa,(triface *)&spintet.ver,splitsh,(face *)0x0,
                          (insertvertexflags *)local_118,cavpoints,cavfaces,cavshells,newtets,
                          crosstets,misfaces);
  if (iVar5 == 0) {
    if (local_118 == (undefined1  [4])0x7) {
      pointdealloc(this,pa);
      uVar9 = randomnation(this,(uint)this->encseglist->objects);
      steinpt = (point)(this->encseglist->toparray
                        [(int)(uint)uVar9 >> ((byte)this->encseglist->log2objectsperblock & 0x1f)] +
                       (int)(((uint)uVar9 & this->encseglist->objectsperblockmark) *
                            this->encseglist->objectbytes));
      face::operator=((face *)&paryseg,(face *)steinpt);
      arraypool::restart(this->encseglist);
      pdVar7 = sorg(this,(face *)&paryseg);
      pdVar8 = sdest(this,(face *)&paryseg);
      makepoint(this,&pa,FREESEGVERTEX);
      for (local_130 = 0; local_130 < 3; local_130 = local_130 + 1) {
        pa[local_130] = (pdVar7[local_130] + pdVar8[local_130]) * 0.5;
      }
      point2tetorg(this,pdVar7,(triface *)&spintet.ver);
      local_118 = (undefined1  [4])0x1;
      ivf.validflag = 0;
      iVar5 = insertpoint_cdt(this,pa,(triface *)&spintet.ver,splitsh,(face *)&paryseg,
                              (insertvertexflags *)local_118,cavpoints,cavfaces,cavshells,newtets,
                              crosstets,misfaces);
      if (iVar5 == 0) {
        terminatetetgen(this,2);
      }
      if (this->useinsertradius != 0) {
        save_segmentpoint_insradius(this,pa,(point)ivf.smlen,(double)ivf._88_8_);
      }
      this->st_segref_count = this->st_segref_count + 1;
      if (0 < this->steinerleft) {
        this->steinerleft = this->steinerleft + -1;
      }
    }
    else {
      terminatetetgen(this,2);
    }
  }
  else {
    if (this->useinsertradius != 0) {
      save_facetpoint_insradius(this,pa,(point)ivf.smlen,(double)ivf._88_8_);
    }
    this->st_facref_count = this->st_facref_count + 1;
    if (0 < this->steinerleft) {
      this->steinerleft = this->steinerleft + -1;
    }
  }
  while (0 < this->subsegstack->objects) {
    this->subsegstack->objects = this->subsegstack->objects + -1;
    steinpt = (point)(this->subsegstack->toparray
                      [this->subsegstack->objects >>
                       ((byte)this->subsegstack->log2objectsperblock & 0x3f)] +
                     (this->subsegstack->objects & (long)this->subsegstack->objectsperblockmark) *
                     (long)this->subsegstack->objectbytes);
    face::operator=((face *)&paryseg,(face *)steinpt);
    sstpivot1(this,(face *)&paryseg,(triface *)&spintet.ver);
    if (spintet._8_8_ == 0) {
      pdVar7 = sorg(this,(face *)&paryseg);
      pdVar8 = sdest(this,(face *)&paryseg);
      iVar6 = scoutsegment(this,pdVar7,pdVar8,(face *)&paryseg,(triface *)&spintet.ver,&ivf.parentpt
                           ,(arraypool *)0x0);
      if (iVar6 == SHAREEDGE) {
        sstbond1(this,(face *)&paryseg,(triface *)&spintet.ver);
        triface::operator=((triface *)&splitseg.shver,(triface *)&spintet.ver);
        do {
          tssbond1(this,(triface *)&splitseg.shver,(face *)&paryseg);
          iVar5 = (int)spintet.tet;
          decode(this,*(tetrahedron *)(splitseg._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
                 (triface *)&splitseg.shver);
          spintet.tet._0_4_ = facepivot2[iVar5][(int)spintet.tet];
        } while (splitseg._8_8_ != spintet._8_8_);
      }
      else if ((iVar6 == ACROSSFACE) || (iVar6 == ACROSSEDGE)) {
        makepoint(this,&pa,FREESEGVERTEX);
        getsteinerptonsegment(this,(face *)&paryseg,ivf.parentpt,pa);
        local_118 = (undefined1  [4])0x1;
        ivf.validflag = 0;
        iVar5 = insertpoint_cdt(this,pa,(triface *)&spintet.ver,splitsh,(face *)&paryseg,
                                (insertvertexflags *)local_118,cavpoints,cavfaces,cavshells,newtets,
                                crosstets,misfaces);
        if (iVar5 == 0) {
          terminatetetgen(this,2);
        }
        if (this->useinsertradius != 0) {
          save_segmentpoint_insradius(this,pa,(point)ivf.smlen,(double)ivf._88_8_);
        }
        this->st_segref_count = this->st_segref_count + 1;
        if (0 < this->steinerleft) {
          this->steinerleft = this->steinerleft + -1;
        }
      }
      else {
        terminatetetgen(this,2);
      }
    }
  }
  if (2 < this->b->verbose) {
    printf("      Added %ld Steiner points.\n",this->points->items - lVar1);
  }
  return;
}

Assistant:

void tetgenmesh::refineregion(face &splitsh, arraypool *cavpoints, 
                              arraypool *cavfaces, arraypool *cavshells,
                              arraypool *newtets, arraypool *crosstets,
                              arraypool *misfaces)
{
  triface searchtet, spintet;
  face splitseg, *paryseg;
  point steinpt, pa, pb, refpt;
  insertvertexflags ivf;
  enum interresult dir;
  long baknum = points->items;
  int t1ver;
  int i;

  if (b->verbose > 2) {
    printf("      Refining region at edge (%d, %d, %d).\n",
           pointmark(sorg(splitsh)), pointmark(sdest(splitsh)),
           pointmark(sapex(splitsh)));
  }

  // Add the Steiner point at the barycenter of the face.
  pa = sorg(splitsh);
  pb = sdest(splitsh);
  // Create a new point.
  makepoint(&steinpt, FREEFACETVERTEX);
  for (i = 0; i < 3; i++) {
    steinpt[i] = 0.5 * (pa[i] + pb[i]);
  }

  ivf.bowywat = 1; // Use the Bowyer-Watson algorrithm.
  ivf.cdtflag = 1; // Only create the initial cavity.
  ivf.sloc = (int) ONEDGE;
  ivf.sbowywat = 1;
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.

  point2tetorg(pa, searchtet); // Start location from it.
  ivf.iloc = (int) OUTSIDE;

  ivf.rejflag = 1; // Reject it if it encroaches upon any segment.
  if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, NULL, &ivf, cavpoints,
                       cavfaces, cavshells, newtets, crosstets, misfaces)) {
    if (ivf.iloc == (int) ENCSEGMENT) {
      pointdealloc(steinpt);
      // Split an encroached segment.
      i = randomnation(encseglist->objects);
      paryseg = (face *) fastlookup(encseglist, i);
      splitseg = *paryseg;
      encseglist->restart();

      // Split the segment.
      pa = sorg(splitseg);
      pb = sdest(splitseg);
      // Create a new point.
      makepoint(&steinpt, FREESEGVERTEX);
      for (i = 0; i < 3; i++) {
        steinpt[i] = 0.5 * (pa[i] + pb[i]);
      }
      point2tetorg(pa, searchtet);
      ivf.iloc = (int) OUTSIDE;
      ivf.rejflag = 0;
      if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, &splitseg, &ivf,
                           cavpoints, cavfaces, cavshells, newtets, 
                           crosstets, misfaces)) {
        terminatetetgen(this, 2); 
      }
      if (useinsertradius) {
        save_segmentpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
      }
      st_segref_count++;
      if (steinerleft > 0) steinerleft--;
    } else {
      terminatetetgen(this, 2); // assert(0);
    }
  } else {
    if (useinsertradius) {
      save_facetpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
    }
    st_facref_count++;
    if (steinerleft > 0) steinerleft--;
  }

  while (subsegstack->objects > 0l) {
    // seglist is used as a stack.
    subsegstack->objects--;
    paryseg = (face *) fastlookup(subsegstack, subsegstack->objects);
    splitseg = *paryseg;

    // Check if this segment has been recovered.
    sstpivot1(splitseg, searchtet);
    if (searchtet.tet != NULL) continue;

    // Search the segment.
    dir = scoutsegment(sorg(splitseg), sdest(splitseg), &splitseg, &searchtet, 
                       &refpt, NULL);
    if (dir == SHAREEDGE) {
      // Found this segment, insert it.
      // Let the segment remember an adjacent tet.
      sstbond1(splitseg, searchtet);
      // Bond the segment to all tets containing it.
      spintet = searchtet;
      do {
        tssbond1(spintet, splitseg);
        fnextself(spintet);
      } while (spintet.tet != searchtet.tet);
    } else { 
      if ((dir == ACROSSFACE) || (dir == ACROSSEDGE)) {
        // Split the segment.
        makepoint(&steinpt, FREESEGVERTEX);
        getsteinerptonsegment(&splitseg, refpt, steinpt);
        ivf.iloc = (int) OUTSIDE;
        ivf.rejflag = 0;
        if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, &splitseg, &ivf,
                             cavpoints, cavfaces, cavshells, newtets, 
                             crosstets, misfaces)) {
          terminatetetgen(this, 2);
        }
        if (useinsertradius) {
          save_segmentpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
        }
        st_segref_count++;
        if (steinerleft > 0) steinerleft--;
      } else {
        terminatetetgen(this, 2);
      }
    }
  } // while

  if (b->verbose > 2) {
    printf("      Added %ld Steiner points.\n", points->items - baknum);
  }
}